

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Scene *pSVar12;
  Ref<embree::Geometry> *pRVar13;
  Geometry *pGVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  bool bVar37;
  int iVar38;
  AABBNodeMB4D *node1;
  ulong uVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  uint uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong *puVar53;
  ulong uVar54;
  long lVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  bool bVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  vint4 bi;
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  vint4 ai;
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  float fVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar96 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  uint uVar103;
  uint uVar104;
  uint uVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar102 [64];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [64];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  undefined1 auVar115 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  RTCFilterFunctionNArguments local_d30;
  undefined1 local_d00 [32];
  undefined1 local_ce0 [32];
  undefined1 local_cb0 [16];
  undefined1 local_ca0 [16];
  undefined1 local_c90 [16];
  undefined1 local_c80 [16];
  undefined1 local_c70 [16];
  undefined1 local_c60 [16];
  undefined1 local_c50 [16];
  undefined1 local_c40 [16];
  undefined1 local_c30 [16];
  undefined1 local_c20 [16];
  undefined1 local_c10 [16];
  undefined1 local_c00 [16];
  undefined1 local_bf0 [16];
  undefined1 local_be0 [16];
  undefined1 local_bd0 [16];
  undefined1 local_bc0 [16];
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [32];
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  float local_9c0 [4];
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  puVar53 = local_7f8;
  local_800 = root.ptr;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_c40._4_4_ = fVar1;
  local_c40._0_4_ = fVar1;
  local_c40._8_4_ = fVar1;
  local_c40._12_4_ = fVar1;
  auVar81 = ZEXT1664(local_c40);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_c50._4_4_ = fVar2;
  local_c50._0_4_ = fVar2;
  local_c50._8_4_ = fVar2;
  local_c50._12_4_ = fVar2;
  auVar83 = ZEXT1664(local_c50);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar106 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_c60._4_4_ = fVar106;
  local_c60._0_4_ = fVar106;
  local_c60._8_4_ = fVar106;
  local_c60._12_4_ = fVar106;
  auVar86 = ZEXT1664(local_c60);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar106 = fVar106 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar58 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar62 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_c70._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_c70._8_4_ = -fVar1;
  local_c70._12_4_ = -fVar1;
  auVar92 = ZEXT1664(local_c70);
  local_c80._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_c80._8_4_ = -fVar2;
  local_c80._12_4_ = -fVar2;
  auVar96 = ZEXT1664(local_c80);
  local_c90._0_8_ = CONCAT44(fVar106,fVar106) ^ 0x8000000080000000;
  local_c90._8_4_ = -fVar106;
  local_c90._12_4_ = -fVar106;
  auVar102 = ZEXT1664(local_c90);
  iVar38 = (tray->tnear).field_0.i[k];
  local_ca0._4_4_ = iVar38;
  local_ca0._0_4_ = iVar38;
  local_ca0._8_4_ = iVar38;
  local_ca0._12_4_ = iVar38;
  auVar111 = ZEXT1664(local_ca0);
  iVar38 = (tray->tfar).field_0.i[k];
  local_cb0._4_4_ = iVar38;
  local_cb0._0_4_ = iVar38;
  local_cb0._8_4_ = iVar38;
  local_cb0._12_4_ = iVar38;
  auVar114 = ZEXT1664(local_cb0);
  local_b60._16_16_ = mm_lookupmask_ps._240_16_;
  local_b60._0_16_ = mm_lookupmask_ps._0_16_;
  iVar38 = 1 << ((uint)k & 0x1f);
  auVar90._4_4_ = iVar38;
  auVar90._0_4_ = iVar38;
  auVar90._8_4_ = iVar38;
  auVar90._12_4_ = iVar38;
  auVar90._16_4_ = iVar38;
  auVar90._20_4_ = iVar38;
  auVar90._24_4_ = iVar38;
  auVar90._28_4_ = iVar38;
  auVar69 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar90 = vpand_avx2(auVar90,auVar69);
  local_ba0 = vpcmpeqd_avx2(auVar90,auVar69);
  bVar37 = true;
  auVar72._8_4_ = 0x3f800000;
  auVar72._0_8_ = 0x3f8000003f800000;
  auVar72._12_4_ = 0x3f800000;
  auVar72._16_4_ = 0x3f800000;
  auVar72._20_4_ = 0x3f800000;
  auVar72._24_4_ = 0x3f800000;
  auVar72._28_4_ = 0x3f800000;
  auVar69._8_4_ = 0xbf800000;
  auVar69._0_8_ = 0xbf800000bf800000;
  auVar69._12_4_ = 0xbf800000;
  auVar69._16_4_ = 0xbf800000;
  auVar69._20_4_ = 0xbf800000;
  auVar69._24_4_ = 0xbf800000;
  auVar69._28_4_ = 0xbf800000;
  local_b80 = vblendvps_avx(auVar72,auVar69,local_b60);
  do {
    uVar64 = puVar53[-1];
    puVar53 = puVar53 + -1;
    while ((uVar64 & 8) == 0) {
      uVar39 = uVar64 & 0xfffffffffffffff0;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar66._4_4_ = uVar3;
      auVar66._0_4_ = uVar3;
      auVar66._8_4_ = uVar3;
      auVar66._12_4_ = uVar3;
      auVar67 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x80 + uVar58),auVar66,
                                *(undefined1 (*) [16])(uVar39 + 0x20 + uVar58));
      auVar67 = vfmadd213ps_fma(auVar67,auVar81._0_16_,auVar92._0_16_);
      auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x80 + uVar62),auVar66,
                                *(undefined1 (*) [16])(uVar39 + 0x20 + uVar62));
      auVar26 = vfmadd213ps_fma(auVar26,auVar83._0_16_,auVar96._0_16_);
      auVar67 = vpmaxsd_avx(auVar67,auVar26);
      auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x80 + uVar44),auVar66,
                                *(undefined1 (*) [16])(uVar39 + 0x20 + uVar44));
      auVar26 = vfmadd213ps_fma(auVar26,auVar86._0_16_,auVar102._0_16_);
      auVar26 = vpmaxsd_avx(auVar26,auVar111._0_16_);
      auVar67 = vpmaxsd_avx(auVar67,auVar26);
      auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x80 + (uVar58 ^ 0x10)),auVar66,
                                *(undefined1 (*) [16])(uVar39 + 0x20 + (uVar58 ^ 0x10)));
      auVar26 = vfmadd213ps_fma(auVar26,auVar81._0_16_,auVar92._0_16_);
      auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x80 + (uVar62 ^ 0x10)),auVar66,
                                *(undefined1 (*) [16])(uVar39 + 0x20 + (uVar62 ^ 0x10)));
      auVar27 = vfmadd213ps_fma(auVar27,auVar83._0_16_,auVar96._0_16_);
      auVar26 = vpminsd_avx(auVar26,auVar27);
      auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x80 + (uVar44 ^ 0x10)),auVar66,
                                *(undefined1 (*) [16])(uVar39 + 0x20 + (uVar44 ^ 0x10)));
      auVar27 = vfmadd213ps_fma(auVar27,auVar86._0_16_,auVar102._0_16_);
      auVar27 = vpminsd_avx(auVar27,auVar114._0_16_);
      auVar26 = vpminsd_avx(auVar26,auVar27);
      if (((uint)uVar64 & 7) == 6) {
        auVar26 = vcmpps_avx(auVar67,auVar26,2);
        auVar67 = vcmpps_avx(*(undefined1 (*) [16])(uVar39 + 0xe0),auVar66,2);
        auVar27 = vcmpps_avx(auVar66,*(undefined1 (*) [16])(uVar39 + 0xf0),1);
        auVar67 = vandps_avx(auVar67,auVar27);
        auVar67 = vandps_avx(auVar67,auVar26);
      }
      else {
        auVar67 = vcmpps_avx(auVar67,auVar26,2);
      }
      auVar67 = vpslld_avx(auVar67,0x1f);
      uVar43 = vmovmskps_avx(auVar67);
      if (uVar43 == 0) goto joined_r0x00585b75;
      uVar43 = uVar43 & 0xff;
      lVar41 = 0;
      for (uVar64 = (ulong)uVar43; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
        lVar41 = lVar41 + 1;
      }
      uVar64 = *(ulong *)(uVar39 + lVar41 * 8);
      uVar43 = uVar43 - 1 & uVar43;
      uVar45 = (ulong)uVar43;
      if (uVar43 != 0) {
        *puVar53 = uVar64;
        lVar41 = 0;
        for (; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
          lVar41 = lVar41 + 1;
        }
        uVar43 = uVar43 - 1 & uVar43;
        uVar45 = (ulong)uVar43;
        bVar65 = uVar43 == 0;
        while( true ) {
          puVar53 = puVar53 + 1;
          uVar64 = *(ulong *)(uVar39 + lVar41 * 8);
          if (bVar65) break;
          *puVar53 = uVar64;
          lVar41 = 0;
          for (uVar64 = uVar45; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
            lVar41 = lVar41 + 1;
          }
          uVar45 = uVar45 - 1 & uVar45;
          bVar65 = uVar45 == 0;
        }
      }
    }
    uVar39 = (ulong)((uint)uVar64 & 0xf);
    if (uVar39 != 8) {
      uVar64 = uVar64 & 0xfffffffffffffff0;
      lVar41 = 0;
      do {
        lVar40 = lVar41 * 0x60;
        pSVar12 = context->scene;
        pRVar13 = (pSVar12->geometries).items;
        pGVar14 = pRVar13[*(uint *)(uVar64 + 0x40 + lVar40)].ptr;
        fVar1 = (pGVar14->time_range).lower;
        fVar1 = pGVar14->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar1) / ((pGVar14->time_range).upper - fVar1));
        auVar67 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
        auVar67 = vminss_avx(auVar67,ZEXT416((uint)(pGVar14->fnumTimeSegments + -1.0)));
        auVar19 = vmaxss_avx(ZEXT816(0) << 0x20,auVar67);
        iVar38 = (int)auVar19._0_4_;
        lVar55 = (long)iVar38 * 0x38;
        lVar15 = *(long *)(*(long *)&pGVar14[2].numPrimitives + lVar55);
        uVar54 = (ulong)*(uint *)(uVar64 + 4 + lVar40);
        auVar67 = *(undefined1 (*) [16])(lVar15 + (ulong)*(uint *)(uVar64 + lVar40) * 4);
        uVar47 = (ulong)*(uint *)(uVar64 + 0x10 + lVar40);
        auVar26 = *(undefined1 (*) [16])(lVar15 + uVar47 * 4);
        uVar46 = (ulong)*(uint *)(uVar64 + 0x20 + lVar40);
        auVar27 = *(undefined1 (*) [16])(lVar15 + uVar46 * 4);
        uVar48 = (ulong)*(uint *)(uVar64 + 0x30 + lVar40);
        auVar66 = *(undefined1 (*) [16])(lVar15 + uVar48 * 4);
        lVar15 = *(long *)&pRVar13[*(uint *)(uVar64 + 0x44 + lVar40)].ptr[2].numPrimitives;
        lVar16 = *(long *)(lVar15 + lVar55);
        auVar5 = *(undefined1 (*) [16])(lVar16 + uVar54 * 4);
        uVar49 = (ulong)*(uint *)(uVar64 + 0x14 + lVar40);
        auVar68 = *(undefined1 (*) [16])(lVar16 + uVar49 * 4);
        uVar50 = (ulong)*(uint *)(uVar64 + 0x24 + lVar40);
        auVar6 = *(undefined1 (*) [16])(lVar16 + uVar50 * 4);
        uVar51 = (ulong)*(uint *)(uVar64 + 0x34 + lVar40);
        auVar7 = *(undefined1 (*) [16])(lVar16 + uVar51 * 4);
        lVar16 = *(long *)&pRVar13[*(uint *)(uVar64 + 0x48 + lVar40)].ptr[2].numPrimitives;
        lVar17 = *(long *)(lVar16 + lVar55);
        uVar52 = (ulong)*(uint *)(uVar64 + 8 + lVar40);
        auVar8 = *(undefined1 (*) [16])(lVar17 + uVar52 * 4);
        uVar59 = (ulong)*(uint *)(uVar64 + 0x18 + lVar40);
        auVar9 = *(undefined1 (*) [16])(lVar17 + uVar59 * 4);
        uVar60 = (ulong)*(uint *)(uVar64 + 0x28 + lVar40);
        auVar10 = *(undefined1 (*) [16])(lVar17 + uVar60 * 4);
        uVar61 = (ulong)*(uint *)(uVar64 + 0x38 + lVar40);
        auVar11 = *(undefined1 (*) [16])(lVar17 + uVar61 * 4);
        fVar1 = fVar1 - auVar19._0_4_;
        lVar17 = *(long *)&pRVar13[*(uint *)(uVar64 + 0x4c + lVar40)].ptr[2].numPrimitives;
        lVar55 = *(long *)(lVar17 + lVar55);
        uVar45 = (ulong)*(uint *)(uVar64 + 0xc + lVar40);
        auVar19 = *(undefined1 (*) [16])(lVar55 + uVar45 * 4);
        uVar56 = (ulong)*(uint *)(uVar64 + 0x1c + lVar40);
        auVar74 = *(undefined1 (*) [16])(lVar55 + uVar56 * 4);
        auVar82 = vunpcklps_avx(auVar67,auVar8);
        auVar8 = vunpckhps_avx(auVar67,auVar8);
        auVar94 = vunpcklps_avx(auVar5,auVar19);
        auVar5 = vunpckhps_avx(auVar5,auVar19);
        uVar57 = (ulong)*(uint *)(uVar64 + 0x2c + lVar40);
        auVar67 = *(undefined1 (*) [16])(lVar55 + uVar57 * 4);
        local_bc0 = vunpcklps_avx(auVar8,auVar5);
        local_c00 = vunpcklps_avx(auVar82,auVar94);
        local_be0 = vunpckhps_avx(auVar82,auVar94);
        auVar8 = vunpcklps_avx(auVar26,auVar9);
        auVar5 = vunpckhps_avx(auVar26,auVar9);
        auVar9 = vunpcklps_avx(auVar68,auVar74);
        auVar68 = vunpckhps_avx(auVar68,auVar74);
        uVar63 = (ulong)*(uint *)(uVar64 + 0x3c + lVar40);
        auVar26 = *(undefined1 (*) [16])(lVar55 + uVar63 * 4);
        local_bb0 = vunpcklps_avx(auVar5,auVar68);
        local_bf0 = vunpcklps_avx(auVar8,auVar9);
        local_bd0 = vunpckhps_avx(auVar8,auVar9);
        auVar68 = vunpcklps_avx(auVar27,auVar10);
        auVar27 = vunpckhps_avx(auVar27,auVar10);
        auVar8 = vunpcklps_avx(auVar6,auVar67);
        auVar5 = vunpckhps_avx(auVar6,auVar67);
        lVar42 = (long)(iVar38 + 1) * 0x38;
        lVar55 = *(long *)(*(long *)&pGVar14[2].numPrimitives + lVar42);
        auVar67 = *(undefined1 (*) [16])(lVar55 + (ulong)*(uint *)(uVar64 + lVar40) * 4);
        auVar6 = vunpcklps_avx(auVar27,auVar5);
        local_c20 = vunpcklps_avx(auVar68,auVar8);
        local_c10 = vunpckhps_avx(auVar68,auVar8);
        auVar5 = vunpcklps_avx(auVar66,auVar11);
        auVar27 = vunpckhps_avx(auVar66,auVar11);
        auVar68 = vunpcklps_avx(auVar7,auVar26);
        auVar66 = vunpckhps_avx(auVar7,auVar26);
        lVar16 = *(long *)(lVar16 + lVar42);
        auVar26 = *(undefined1 (*) [16])(lVar16 + uVar52 * 4);
        auVar7 = vunpcklps_avx(auVar27,auVar66);
        auVar8 = vunpcklps_avx(auVar5,auVar68);
        local_c30 = vunpckhps_avx(auVar5,auVar68);
        lVar15 = *(long *)(lVar15 + lVar42);
        auVar66 = vunpcklps_avx(auVar67,auVar26);
        auVar27 = vunpckhps_avx(auVar67,auVar26);
        auVar67 = *(undefined1 (*) [16])(lVar15 + uVar54 * 4);
        lVar17 = *(long *)(lVar17 + lVar42);
        auVar26 = *(undefined1 (*) [16])(lVar17 + uVar45 * 4);
        auVar5 = vunpcklps_avx(auVar67,auVar26);
        auVar67 = vunpckhps_avx(auVar67,auVar26);
        auVar9 = vunpcklps_avx(auVar27,auVar67);
        auVar10 = vunpcklps_avx(auVar66,auVar5);
        auVar27 = vunpckhps_avx(auVar66,auVar5);
        auVar67 = *(undefined1 (*) [16])(lVar55 + uVar47 * 4);
        auVar26 = *(undefined1 (*) [16])(lVar16 + uVar59 * 4);
        auVar5 = vunpcklps_avx(auVar67,auVar26);
        auVar66 = vunpckhps_avx(auVar67,auVar26);
        auVar67 = *(undefined1 (*) [16])(lVar15 + uVar49 * 4);
        auVar26 = *(undefined1 (*) [16])(lVar17 + uVar56 * 4);
        auVar68 = vunpcklps_avx(auVar67,auVar26);
        auVar67 = vunpckhps_avx(auVar67,auVar26);
        auVar11 = vunpcklps_avx(auVar66,auVar67);
        auVar19 = vunpcklps_avx(auVar5,auVar68);
        auVar66 = vunpckhps_avx(auVar5,auVar68);
        auVar67 = *(undefined1 (*) [16])(lVar55 + uVar46 * 4);
        auVar26 = *(undefined1 (*) [16])(lVar16 + uVar60 * 4);
        auVar68 = vunpcklps_avx(auVar67,auVar26);
        auVar5 = vunpckhps_avx(auVar67,auVar26);
        auVar67 = *(undefined1 (*) [16])(lVar15 + uVar50 * 4);
        auVar26 = *(undefined1 (*) [16])(lVar17 + uVar57 * 4);
        auVar74 = vunpcklps_avx(auVar67,auVar26);
        auVar67 = vunpckhps_avx(auVar67,auVar26);
        auVar82 = vunpcklps_avx(auVar5,auVar67);
        auVar94 = vunpcklps_avx(auVar68,auVar74);
        auVar5 = vunpckhps_avx(auVar68,auVar74);
        auVar67 = *(undefined1 (*) [16])(lVar55 + uVar48 * 4);
        auVar26 = *(undefined1 (*) [16])(lVar16 + uVar61 * 4);
        auVar74 = vunpcklps_avx(auVar67,auVar26);
        auVar68 = vunpckhps_avx(auVar67,auVar26);
        auVar67 = *(undefined1 (*) [16])(lVar15 + uVar51 * 4);
        auVar26 = *(undefined1 (*) [16])(lVar17 + uVar63 * 4);
        auVar71 = vunpcklps_avx(auVar67,auVar26);
        auVar67 = vunpckhps_avx(auVar67,auVar26);
        auVar26 = vunpcklps_avx(auVar68,auVar67);
        auVar68 = vunpcklps_avx(auVar74,auVar71);
        auVar67 = vunpckhps_avx(auVar74,auVar71);
        fVar2 = 1.0 - fVar1;
        auVar71._4_4_ = fVar2;
        auVar71._0_4_ = fVar2;
        auVar71._8_4_ = fVar2;
        auVar71._12_4_ = fVar2;
        auVar77._0_4_ = fVar1 * auVar10._0_4_;
        auVar77._4_4_ = fVar1 * auVar10._4_4_;
        auVar77._8_4_ = fVar1 * auVar10._8_4_;
        auVar77._12_4_ = fVar1 * auVar10._12_4_;
        auVar10 = vfmadd231ps_fma(auVar77,auVar71,local_c00);
        auVar84._0_4_ = fVar1 * auVar27._0_4_;
        auVar84._4_4_ = fVar1 * auVar27._4_4_;
        auVar84._8_4_ = fVar1 * auVar27._8_4_;
        auVar84._12_4_ = fVar1 * auVar27._12_4_;
        auVar27 = vfmadd231ps_fma(auVar84,auVar71,local_be0);
        auVar79._0_4_ = auVar9._0_4_ * fVar1;
        auVar79._4_4_ = auVar9._4_4_ * fVar1;
        auVar79._8_4_ = auVar9._8_4_ * fVar1;
        auVar79._12_4_ = auVar9._12_4_ * fVar1;
        auVar9 = vfmadd231ps_fma(auVar79,auVar71,local_bc0);
        auVar74._0_4_ = fVar1 * auVar19._0_4_;
        auVar74._4_4_ = fVar1 * auVar19._4_4_;
        auVar74._8_4_ = fVar1 * auVar19._8_4_;
        auVar74._12_4_ = fVar1 * auVar19._12_4_;
        auVar19 = vfmadd231ps_fma(auVar74,auVar71,local_bf0);
        auVar87._0_4_ = fVar1 * auVar66._0_4_;
        auVar87._4_4_ = fVar1 * auVar66._4_4_;
        auVar87._8_4_ = fVar1 * auVar66._8_4_;
        auVar87._12_4_ = fVar1 * auVar66._12_4_;
        auVar66 = vfmadd231ps_fma(auVar87,auVar71,local_bd0);
        auVar116._0_4_ = auVar11._0_4_ * fVar1;
        auVar116._4_4_ = auVar11._4_4_ * fVar1;
        auVar116._8_4_ = auVar11._8_4_ * fVar1;
        auVar116._12_4_ = auVar11._12_4_ * fVar1;
        auVar11 = vfmadd231ps_fma(auVar116,auVar71,local_bb0);
        auVar100._0_4_ = auVar94._0_4_ * fVar1;
        auVar100._4_4_ = auVar94._4_4_ * fVar1;
        auVar100._8_4_ = auVar94._8_4_ * fVar1;
        auVar100._12_4_ = auVar94._12_4_ * fVar1;
        auVar74 = vfmadd231ps_fma(auVar100,auVar71,local_c20);
        auVar112._0_4_ = auVar5._0_4_ * fVar1;
        auVar112._4_4_ = auVar5._4_4_ * fVar1;
        auVar112._8_4_ = auVar5._8_4_ * fVar1;
        auVar112._12_4_ = auVar5._12_4_ * fVar1;
        auVar5 = vfmadd231ps_fma(auVar112,auVar71,local_c10);
        auVar119._0_4_ = auVar82._0_4_ * fVar1;
        auVar119._4_4_ = auVar82._4_4_ * fVar1;
        auVar119._8_4_ = auVar82._8_4_ * fVar1;
        auVar119._12_4_ = auVar82._12_4_ * fVar1;
        auVar6 = vfmadd231ps_fma(auVar119,auVar71,auVar6);
        auVar82._0_4_ = fVar1 * auVar68._0_4_;
        auVar82._4_4_ = fVar1 * auVar68._4_4_;
        auVar82._8_4_ = fVar1 * auVar68._8_4_;
        auVar82._12_4_ = fVar1 * auVar68._12_4_;
        auVar94._0_4_ = auVar67._0_4_ * fVar1;
        auVar94._4_4_ = auVar67._4_4_ * fVar1;
        auVar94._8_4_ = auVar67._8_4_ * fVar1;
        auVar94._12_4_ = auVar67._12_4_ * fVar1;
        auVar68._0_4_ = auVar26._0_4_ * fVar1;
        auVar68._4_4_ = auVar26._4_4_ * fVar1;
        auVar68._8_4_ = auVar26._8_4_ * fVar1;
        auVar68._12_4_ = auVar26._12_4_ * fVar1;
        auVar67 = vfmadd231ps_fma(auVar82,auVar71,auVar8);
        auVar26 = vfmadd231ps_fma(auVar94,auVar71,local_c30);
        lVar15 = uVar64 + 0x40 + lVar40;
        local_b20 = *(undefined8 *)(lVar15 + 0x10);
        uStack_b18 = *(undefined8 *)(lVar15 + 0x18);
        uStack_b10 = local_b20;
        uStack_b08 = uStack_b18;
        lVar40 = uVar64 + 0x50 + lVar40;
        local_b40 = *(undefined8 *)(lVar40 + 0x10);
        uStack_b38 = *(undefined8 *)(lVar40 + 0x18);
        auVar68 = vfmadd231ps_fma(auVar68,auVar71,auVar7);
        uStack_b30 = local_b40;
        uStack_b28 = uStack_b38;
        auVar78._16_16_ = auVar74;
        auVar78._0_16_ = auVar10;
        auVar85._16_16_ = auVar5;
        auVar85._0_16_ = auVar27;
        auVar120._16_16_ = auVar6;
        auVar120._0_16_ = auVar9;
        auVar73._16_16_ = auVar19;
        auVar73._0_16_ = auVar19;
        auVar75._16_16_ = auVar66;
        auVar75._0_16_ = auVar66;
        auVar80._16_16_ = auVar11;
        auVar80._0_16_ = auVar11;
        auVar88._16_16_ = auVar67;
        auVar88._0_16_ = auVar67;
        auVar109._16_16_ = auVar26;
        auVar109._0_16_ = auVar26;
        auVar70._16_16_ = auVar68;
        auVar70._0_16_ = auVar68;
        auVar69 = vsubps_avx(auVar78,auVar73);
        auVar90 = vsubps_avx(auVar85,auVar75);
        auVar72 = vsubps_avx(auVar120,auVar80);
        auVar73 = vsubps_avx(auVar88,auVar78);
        auVar22 = vsubps_avx(auVar109,auVar85);
        auVar23 = vsubps_avx(auVar70,auVar120);
        auVar24._4_4_ = auVar90._4_4_ * auVar23._4_4_;
        auVar24._0_4_ = auVar90._0_4_ * auVar23._0_4_;
        auVar24._8_4_ = auVar90._8_4_ * auVar23._8_4_;
        auVar24._12_4_ = auVar90._12_4_ * auVar23._12_4_;
        auVar24._16_4_ = auVar90._16_4_ * auVar23._16_4_;
        auVar24._20_4_ = auVar90._20_4_ * auVar23._20_4_;
        auVar24._24_4_ = auVar90._24_4_ * auVar23._24_4_;
        auVar24._28_4_ = auVar68._12_4_;
        auVar66 = vfmsub231ps_fma(auVar24,auVar22,auVar72);
        auVar25._4_4_ = auVar72._4_4_ * auVar73._4_4_;
        auVar25._0_4_ = auVar72._0_4_ * auVar73._0_4_;
        auVar25._8_4_ = auVar72._8_4_ * auVar73._8_4_;
        auVar25._12_4_ = auVar72._12_4_ * auVar73._12_4_;
        auVar25._16_4_ = auVar72._16_4_ * auVar73._16_4_;
        auVar25._20_4_ = auVar72._20_4_ * auVar73._20_4_;
        auVar25._24_4_ = auVar72._24_4_ * auVar73._24_4_;
        auVar25._28_4_ = auVar19._12_4_;
        auVar5 = vfmsub231ps_fma(auVar25,auVar23,auVar69);
        uVar3 = *(undefined4 *)(ray + k * 4);
        auVar89._4_4_ = uVar3;
        auVar89._0_4_ = uVar3;
        auVar89._8_4_ = uVar3;
        auVar89._12_4_ = uVar3;
        auVar89._16_4_ = uVar3;
        auVar89._20_4_ = uVar3;
        auVar89._24_4_ = uVar3;
        auVar89._28_4_ = uVar3;
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar117._4_4_ = uVar3;
        auVar117._0_4_ = uVar3;
        auVar117._8_4_ = uVar3;
        auVar117._12_4_ = uVar3;
        auVar117._16_4_ = uVar3;
        auVar117._20_4_ = uVar3;
        auVar117._24_4_ = uVar3;
        auVar117._28_4_ = uVar3;
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar122._4_4_ = uVar3;
        auVar122._0_4_ = uVar3;
        auVar122._8_4_ = uVar3;
        auVar122._12_4_ = uVar3;
        auVar122._16_4_ = uVar3;
        auVar122._20_4_ = uVar3;
        auVar122._24_4_ = uVar3;
        auVar122._28_4_ = uVar3;
        fVar1 = *(float *)(ray + k * 4 + 0x80);
        auVar110._4_4_ = fVar1;
        auVar110._0_4_ = fVar1;
        auVar110._8_4_ = fVar1;
        auVar110._12_4_ = fVar1;
        auVar110._16_4_ = fVar1;
        auVar110._20_4_ = fVar1;
        auVar110._24_4_ = fVar1;
        auVar110._28_4_ = fVar1;
        auVar24 = vsubps_avx(auVar78,auVar89);
        fVar2 = *(float *)(ray + k * 4 + 0xa0);
        auVar115._4_4_ = fVar2;
        auVar115._0_4_ = fVar2;
        auVar115._8_4_ = fVar2;
        auVar115._12_4_ = fVar2;
        auVar115._16_4_ = fVar2;
        auVar115._20_4_ = fVar2;
        auVar115._24_4_ = fVar2;
        auVar115._28_4_ = fVar2;
        auVar25 = vsubps_avx(auVar85,auVar117);
        fVar106 = *(float *)(ray + k * 4 + 0xc0);
        auVar118._4_4_ = fVar106;
        auVar118._0_4_ = fVar106;
        auVar118._8_4_ = fVar106;
        auVar118._12_4_ = fVar106;
        auVar118._16_4_ = fVar106;
        auVar118._20_4_ = fVar106;
        auVar118._24_4_ = fVar106;
        auVar118._28_4_ = fVar106;
        auVar70 = vsubps_avx(auVar120,auVar122);
        auVar28._4_4_ = fVar1 * auVar25._4_4_;
        auVar28._0_4_ = fVar1 * auVar25._0_4_;
        auVar28._8_4_ = fVar1 * auVar25._8_4_;
        auVar28._12_4_ = fVar1 * auVar25._12_4_;
        auVar28._16_4_ = fVar1 * auVar25._16_4_;
        auVar28._20_4_ = fVar1 * auVar25._20_4_;
        auVar28._24_4_ = fVar1 * auVar25._24_4_;
        auVar28._28_4_ = auVar6._12_4_;
        auVar67 = vfmsub231ps_fma(auVar28,auVar24,auVar115);
        auVar29._4_4_ = auVar23._4_4_ * auVar67._4_4_;
        auVar29._0_4_ = auVar23._0_4_ * auVar67._0_4_;
        auVar29._8_4_ = auVar23._8_4_ * auVar67._8_4_;
        auVar29._12_4_ = auVar23._12_4_ * auVar67._12_4_;
        auVar29._16_4_ = auVar23._16_4_ * 0.0;
        auVar29._20_4_ = auVar23._20_4_ * 0.0;
        auVar29._24_4_ = auVar23._24_4_ * 0.0;
        auVar29._28_4_ = auVar23._28_4_;
        auVar121._0_4_ = auVar72._0_4_ * auVar67._0_4_;
        auVar121._4_4_ = auVar72._4_4_ * auVar67._4_4_;
        auVar121._8_4_ = auVar72._8_4_ * auVar67._8_4_;
        auVar121._12_4_ = auVar72._12_4_ * auVar67._12_4_;
        auVar121._16_4_ = auVar72._16_4_ * 0.0;
        auVar121._20_4_ = auVar72._20_4_ * 0.0;
        auVar121._24_4_ = auVar72._24_4_ * 0.0;
        auVar121._28_4_ = 0;
        auVar23._4_4_ = fVar106 * auVar24._4_4_;
        auVar23._0_4_ = fVar106 * auVar24._0_4_;
        auVar23._8_4_ = fVar106 * auVar24._8_4_;
        auVar23._12_4_ = fVar106 * auVar24._12_4_;
        auVar23._16_4_ = fVar106 * auVar24._16_4_;
        auVar23._20_4_ = fVar106 * auVar24._20_4_;
        auVar23._24_4_ = fVar106 * auVar24._24_4_;
        auVar23._28_4_ = auVar72._28_4_;
        auVar26 = vfmsub231ps_fma(auVar23,auVar70,auVar110);
        auVar67 = vfmadd231ps_fma(auVar29,ZEXT1632(auVar26),auVar22);
        auVar26 = vfmadd231ps_fma(auVar121,auVar90,ZEXT1632(auVar26));
        auVar30._4_4_ = auVar69._4_4_ * auVar22._4_4_;
        auVar30._0_4_ = auVar69._0_4_ * auVar22._0_4_;
        auVar30._8_4_ = auVar69._8_4_ * auVar22._8_4_;
        auVar30._12_4_ = auVar69._12_4_ * auVar22._12_4_;
        auVar30._16_4_ = auVar69._16_4_ * auVar22._16_4_;
        auVar30._20_4_ = auVar69._20_4_ * auVar22._20_4_;
        auVar30._24_4_ = auVar69._24_4_ * auVar22._24_4_;
        auVar30._28_4_ = auVar22._28_4_;
        auVar68 = vfmsub231ps_fma(auVar30,auVar73,auVar90);
        auVar22._4_4_ = fVar2 * auVar70._4_4_;
        auVar22._0_4_ = fVar2 * auVar70._0_4_;
        auVar22._8_4_ = fVar2 * auVar70._8_4_;
        auVar22._12_4_ = fVar2 * auVar70._12_4_;
        auVar22._16_4_ = fVar2 * auVar70._16_4_;
        auVar22._20_4_ = fVar2 * auVar70._20_4_;
        auVar22._24_4_ = fVar2 * auVar70._24_4_;
        auVar22._28_4_ = auVar90._28_4_;
        auVar6 = vfmsub231ps_fma(auVar22,auVar25,auVar118);
        fVar1 = auVar68._0_4_;
        fVar2 = auVar68._4_4_;
        auVar31._4_4_ = fVar106 * fVar2;
        auVar31._0_4_ = fVar106 * fVar1;
        fVar20 = auVar68._8_4_;
        auVar31._8_4_ = fVar106 * fVar20;
        fVar21 = auVar68._12_4_;
        auVar31._12_4_ = fVar106 * fVar21;
        auVar31._16_4_ = fVar106 * 0.0;
        auVar31._20_4_ = fVar106 * 0.0;
        auVar31._24_4_ = fVar106 * 0.0;
        auVar31._28_4_ = fVar106;
        auVar27 = vfmadd231ps_fma(auVar31,ZEXT1632(auVar5),auVar115);
        auVar27 = vfmadd231ps_fma(ZEXT1632(auVar27),ZEXT1632(auVar66),auVar110);
        auVar101._8_4_ = 0x80000000;
        auVar101._0_8_ = 0x8000000080000000;
        auVar101._12_4_ = 0x80000000;
        auVar101._16_4_ = 0x80000000;
        auVar101._20_4_ = 0x80000000;
        auVar101._24_4_ = 0x80000000;
        auVar101._28_4_ = 0x80000000;
        auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),ZEXT1632(auVar6),auVar73);
        auVar90 = vandps_avx(ZEXT1632(auVar27),auVar101);
        uVar43 = auVar90._0_4_;
        local_b00._0_4_ = (float)(uVar43 ^ auVar67._0_4_);
        uVar103 = auVar90._4_4_;
        local_b00._4_4_ = (float)(uVar103 ^ auVar67._4_4_);
        uVar104 = auVar90._8_4_;
        local_b00._8_4_ = (float)(uVar104 ^ auVar67._8_4_);
        uVar105 = auVar90._12_4_;
        local_b00._12_4_ = (float)(uVar105 ^ auVar67._12_4_);
        fVar106 = auVar90._16_4_;
        local_b00._16_4_ = fVar106;
        fVar107 = auVar90._20_4_;
        local_b00._20_4_ = fVar107;
        fVar108 = auVar90._24_4_;
        local_b00._24_4_ = fVar108;
        fStack_9a4 = auVar90._28_4_;
        local_b00._28_4_ = fStack_9a4;
        auVar67 = vfmadd231ps_fma(ZEXT1632(auVar26),auVar69,ZEXT1632(auVar6));
        local_ae0._0_4_ = (float)(uVar43 ^ auVar67._0_4_);
        local_ae0._4_4_ = (float)(uVar103 ^ auVar67._4_4_);
        local_ae0._8_4_ = (float)(uVar104 ^ auVar67._8_4_);
        local_ae0._12_4_ = (float)(uVar105 ^ auVar67._12_4_);
        local_ae0._16_4_ = fVar106;
        local_ae0._20_4_ = fVar107;
        local_ae0._24_4_ = fVar108;
        local_ae0._28_4_ = fStack_9a4;
        auVar90 = vcmpps_avx(local_b00,ZEXT832(0) << 0x20,5);
        auVar69 = vcmpps_avx(local_ae0,ZEXT832(0) << 0x20,5);
        auVar90 = vandps_avx(auVar90,auVar69);
        auVar95._8_4_ = 0x7fffffff;
        auVar95._0_8_ = 0x7fffffff7fffffff;
        auVar95._12_4_ = 0x7fffffff;
        auVar95._16_4_ = 0x7fffffff;
        auVar95._20_4_ = 0x7fffffff;
        auVar95._24_4_ = 0x7fffffff;
        auVar95._28_4_ = 0x7fffffff;
        local_aa0 = vandps_avx(ZEXT1632(auVar27),auVar95);
        auVar69 = vcmpps_avx(ZEXT1632(auVar27),ZEXT832(0) << 0x20,4);
        auVar90 = vandps_avx(auVar90,auVar69);
        auVar113._0_4_ = local_b00._0_4_ + local_ae0._0_4_;
        auVar113._4_4_ = local_b00._4_4_ + local_ae0._4_4_;
        auVar113._8_4_ = local_b00._8_4_ + local_ae0._8_4_;
        auVar113._12_4_ = local_b00._12_4_ + local_ae0._12_4_;
        auVar113._16_4_ = fVar106 + fVar106;
        auVar113._20_4_ = fVar107 + fVar107;
        auVar113._24_4_ = fVar108 + fVar108;
        auVar113._28_4_ = fStack_9a4 + fStack_9a4;
        auVar69 = vcmpps_avx(auVar113,local_aa0,2);
        auVar72 = auVar69 & auVar90;
        if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar72 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar72 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar72 >> 0x7f,0) != '\0') ||
              (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar72 >> 0xbf,0) != '\0') ||
            (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar72[0x1f] < '\0') {
          auVar90 = vandps_avx(auVar90,auVar69);
          auVar67 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
          auVar32._4_4_ = fVar2 * auVar70._4_4_;
          auVar32._0_4_ = fVar1 * auVar70._0_4_;
          auVar32._8_4_ = fVar20 * auVar70._8_4_;
          auVar32._12_4_ = fVar21 * auVar70._12_4_;
          auVar32._16_4_ = auVar70._16_4_ * 0.0;
          auVar32._20_4_ = auVar70._20_4_ * 0.0;
          auVar32._24_4_ = auVar70._24_4_ * 0.0;
          auVar32._28_4_ = auVar70._28_4_;
          auVar26 = vfmadd213ps_fma(auVar25,ZEXT1632(auVar5),auVar32);
          auVar26 = vfmadd213ps_fma(auVar24,ZEXT1632(auVar66),ZEXT1632(auVar26));
          local_ac0._0_4_ = (float)(uVar43 ^ auVar26._0_4_);
          local_ac0._4_4_ = (float)(uVar103 ^ auVar26._4_4_);
          local_ac0._8_4_ = (float)(uVar104 ^ auVar26._8_4_);
          local_ac0._12_4_ = (float)(uVar105 ^ auVar26._12_4_);
          local_ac0._16_4_ = fVar106;
          local_ac0._20_4_ = fVar107;
          local_ac0._24_4_ = fVar108;
          local_ac0._28_4_ = fStack_9a4;
          fVar93 = *(float *)(ray + k * 4 + 0x60);
          auVar33._4_4_ = local_aa0._4_4_ * fVar93;
          auVar33._0_4_ = local_aa0._0_4_ * fVar93;
          auVar33._8_4_ = local_aa0._8_4_ * fVar93;
          auVar33._12_4_ = local_aa0._12_4_ * fVar93;
          auVar33._16_4_ = local_aa0._16_4_ * fVar93;
          auVar33._20_4_ = local_aa0._20_4_ * fVar93;
          auVar33._24_4_ = local_aa0._24_4_ * fVar93;
          auVar33._28_4_ = fVar93;
          auVar90 = vcmpps_avx(auVar33,local_ac0,1);
          fVar93 = *(float *)(ray + k * 4 + 0x100);
          auVar81 = ZEXT3264(CONCAT428(fVar93,CONCAT424(fVar93,CONCAT420(fVar93,CONCAT416(fVar93,
                                                  CONCAT412(fVar93,CONCAT48(fVar93,CONCAT44(fVar93,
                                                  fVar93))))))));
          auVar34._4_4_ = local_aa0._4_4_ * fVar93;
          auVar34._0_4_ = local_aa0._0_4_ * fVar93;
          auVar34._8_4_ = local_aa0._8_4_ * fVar93;
          auVar34._12_4_ = local_aa0._12_4_ * fVar93;
          auVar34._16_4_ = local_aa0._16_4_ * fVar93;
          auVar34._20_4_ = local_aa0._20_4_ * fVar93;
          auVar34._24_4_ = local_aa0._24_4_ * fVar93;
          auVar34._28_4_ = auVar70._28_4_;
          auVar69 = vcmpps_avx(local_ac0,auVar34,2);
          auVar90 = vandps_avx(auVar90,auVar69);
          auVar26 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
          auVar67 = vpand_avx(auVar67,auVar26);
          auVar90 = vpmovzxwd_avx2(auVar67);
          auVar90 = vpslld_avx2(auVar90,0x1f);
          if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar90 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar90 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar90 >> 0x7f,0) != '\0') ||
                (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar90 >> 0xbf,0) != '\0') ||
              (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar90[0x1f] < '\0') {
            local_a20 = vpsrad_avx2(auVar90,0x1f);
            local_a80 = ZEXT1632(auVar66);
            local_a60 = ZEXT1632(auVar5);
            local_a40 = ZEXT1632(auVar68);
            auVar90 = vrcpps_avx(local_aa0);
            local_940 = local_b60;
            auVar91._8_4_ = 0x3f800000;
            auVar91._0_8_ = 0x3f8000003f800000;
            auVar91._12_4_ = 0x3f800000;
            auVar91._16_4_ = 0x3f800000;
            auVar91._20_4_ = 0x3f800000;
            auVar91._24_4_ = 0x3f800000;
            auVar91._28_4_ = 0x3f800000;
            auVar26 = vfnmadd213ps_fma(local_aa0,auVar90,auVar91);
            auVar26 = vfmadd132ps_fma(ZEXT1632(auVar26),auVar90,auVar90);
            fVar93 = auVar26._0_4_;
            fVar97 = auVar26._4_4_;
            fVar98 = auVar26._8_4_;
            fVar99 = auVar26._12_4_;
            local_9c0[0] = fVar93 * local_ac0._0_4_;
            local_9c0[1] = fVar97 * local_ac0._4_4_;
            local_9c0[2] = fVar98 * local_ac0._8_4_;
            local_9c0[3] = fVar99 * local_ac0._12_4_;
            fStack_9b0 = fVar106 * 0.0;
            fStack_9ac = fVar107 * 0.0;
            fStack_9a8 = fVar108 * 0.0;
            auVar35._4_4_ = fVar97 * local_b00._4_4_;
            auVar35._0_4_ = fVar93 * local_b00._0_4_;
            auVar35._8_4_ = fVar98 * local_b00._8_4_;
            auVar35._12_4_ = fVar99 * local_b00._12_4_;
            auVar35._16_4_ = fVar106 * 0.0;
            auVar35._20_4_ = fVar107 * 0.0;
            auVar35._24_4_ = fVar108 * 0.0;
            auVar35._28_4_ = fStack_9a4;
            auVar90 = vminps_avx(auVar35,auVar91);
            auVar36._4_4_ = fVar97 * local_ae0._4_4_;
            auVar36._0_4_ = fVar93 * local_ae0._0_4_;
            auVar36._8_4_ = fVar98 * local_ae0._8_4_;
            auVar36._12_4_ = fVar99 * local_ae0._12_4_;
            auVar36._16_4_ = fVar106 * 0.0;
            auVar36._20_4_ = fVar107 * 0.0;
            auVar36._24_4_ = fVar108 * 0.0;
            auVar36._28_4_ = fStack_9a4;
            auVar69 = vminps_avx(auVar36,auVar91);
            auVar72 = vsubps_avx(auVar91,auVar90);
            auVar73 = vsubps_avx(auVar91,auVar69);
            local_9e0 = vblendvps_avx(auVar69,auVar72,local_b60);
            local_a00 = vblendvps_avx(auVar90,auVar73,local_b60);
            fVar106 = local_b80._0_4_;
            local_9a0._0_4_ = auVar66._0_4_ * fVar106;
            fVar107 = local_b80._4_4_;
            local_9a0._4_4_ = auVar66._4_4_ * fVar107;
            fVar108 = local_b80._8_4_;
            local_9a0._8_4_ = auVar66._8_4_ * fVar108;
            fVar93 = local_b80._12_4_;
            local_9a0._12_4_ = auVar66._12_4_ * fVar93;
            fVar97 = local_b80._16_4_;
            local_9a0._16_4_ = fVar97 * 0.0;
            fVar98 = local_b80._20_4_;
            local_9a0._20_4_ = fVar98 * 0.0;
            fVar99 = local_b80._24_4_;
            local_9a0._24_4_ = fVar99 * 0.0;
            local_9a0._28_4_ = 0;
            local_980._0_4_ = fVar106 * auVar5._0_4_;
            local_980._4_4_ = fVar107 * auVar5._4_4_;
            local_980._8_4_ = fVar108 * auVar5._8_4_;
            local_980._12_4_ = fVar93 * auVar5._12_4_;
            local_980._16_4_ = fVar97 * 0.0;
            local_980._20_4_ = fVar98 * 0.0;
            local_980._24_4_ = fVar99 * 0.0;
            local_980._28_4_ = 0;
            local_960._0_4_ = fVar106 * fVar1;
            local_960._4_4_ = fVar107 * fVar2;
            local_960._8_4_ = fVar108 * fVar20;
            local_960._12_4_ = fVar93 * fVar21;
            local_960._16_4_ = fVar97 * 0.0;
            local_960._20_4_ = fVar98 * 0.0;
            local_960._24_4_ = fVar99 * 0.0;
            local_960._28_4_ = 0;
            auVar67 = vpsllw_avx(auVar67,0xf);
            auVar67 = vpacksswb_avx(auVar67,auVar67);
            uVar45 = (ulong)(byte)(SUB161(auVar67 >> 7,0) & 1 | (SUB161(auVar67 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar67 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar67 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar67 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar67 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar67 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar67 >> 0x3f,0) << 7);
            do {
              uVar47 = 0;
              for (uVar46 = uVar45; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
                uVar47 = uVar47 + 1;
              }
              uVar43 = *(uint *)((long)&local_b20 + uVar47 * 4);
              pGVar14 = (pSVar12->geometries).items[uVar43].ptr;
              if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar14->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00585b99:
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                  return bVar37;
                }
                local_d00 = auVar81._0_32_;
                uVar46 = (ulong)(uint)((int)uVar47 * 4);
                uVar3 = *(undefined4 *)(local_a00 + uVar46);
                local_8c0._4_4_ = uVar3;
                local_8c0._0_4_ = uVar3;
                local_8c0._8_4_ = uVar3;
                local_8c0._12_4_ = uVar3;
                local_8c0._16_4_ = uVar3;
                local_8c0._20_4_ = uVar3;
                local_8c0._24_4_ = uVar3;
                local_8c0._28_4_ = uVar3;
                local_8a0 = *(undefined4 *)(local_9e0 + uVar46);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)((long)local_9c0 + uVar46);
                local_d30.context = context->user;
                uVar3 = *(undefined4 *)((long)&local_b40 + uVar46);
                local_880._4_4_ = uVar3;
                local_880._0_4_ = uVar3;
                local_880._8_4_ = uVar3;
                local_880._12_4_ = uVar3;
                local_880._16_4_ = uVar3;
                local_880._20_4_ = uVar3;
                local_880._24_4_ = uVar3;
                local_880._28_4_ = uVar3;
                uVar3 = *(undefined4 *)(local_9a0 + uVar46);
                uVar4 = *(undefined4 *)(local_980 + uVar46);
                local_900._4_4_ = uVar4;
                local_900._0_4_ = uVar4;
                local_900._8_4_ = uVar4;
                local_900._12_4_ = uVar4;
                local_900._16_4_ = uVar4;
                local_900._20_4_ = uVar4;
                local_900._24_4_ = uVar4;
                local_900._28_4_ = uVar4;
                uVar4 = *(undefined4 *)(local_960 + uVar46);
                local_8e0._4_4_ = uVar4;
                local_8e0._0_4_ = uVar4;
                local_8e0._8_4_ = uVar4;
                local_8e0._12_4_ = uVar4;
                local_8e0._16_4_ = uVar4;
                local_8e0._20_4_ = uVar4;
                local_8e0._24_4_ = uVar4;
                local_8e0._28_4_ = uVar4;
                local_860._4_4_ = uVar43;
                local_860._0_4_ = uVar43;
                local_860._8_4_ = uVar43;
                local_860._12_4_ = uVar43;
                local_860._16_4_ = uVar43;
                local_860._20_4_ = uVar43;
                local_860._24_4_ = uVar43;
                local_860._28_4_ = uVar43;
                local_920[0] = (RTCHitN)(char)uVar3;
                local_920[1] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[2] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[3] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[4] = (RTCHitN)(char)uVar3;
                local_920[5] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[6] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[7] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[8] = (RTCHitN)(char)uVar3;
                local_920[9] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[10] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[0xb] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[0xc] = (RTCHitN)(char)uVar3;
                local_920[0xd] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[0xe] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[0xf] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[0x10] = (RTCHitN)(char)uVar3;
                local_920[0x11] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[0x12] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[0x13] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[0x14] = (RTCHitN)(char)uVar3;
                local_920[0x15] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[0x16] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[0x17] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[0x18] = (RTCHitN)(char)uVar3;
                local_920[0x19] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[0x1a] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[0x1b] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[0x1c] = (RTCHitN)(char)uVar3;
                local_920[0x1d] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[0x1e] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[0x1f] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                uStack_89c = local_8a0;
                uStack_898 = local_8a0;
                uStack_894 = local_8a0;
                uStack_890 = local_8a0;
                uStack_88c = local_8a0;
                uStack_888 = local_8a0;
                uStack_884 = local_8a0;
                vpcmpeqd_avx2(local_8c0,local_8c0);
                uStack_83c = (local_d30.context)->instID[0];
                local_840 = uStack_83c;
                uStack_838 = uStack_83c;
                uStack_834 = uStack_83c;
                uStack_830 = uStack_83c;
                uStack_82c = uStack_83c;
                uStack_828 = uStack_83c;
                uStack_824 = uStack_83c;
                uStack_81c = (local_d30.context)->instPrimID[0];
                local_820 = uStack_81c;
                uStack_818 = uStack_81c;
                uStack_814 = uStack_81c;
                uStack_810 = uStack_81c;
                uStack_80c = uStack_81c;
                uStack_808 = uStack_81c;
                uStack_804 = uStack_81c;
                local_ce0 = local_ba0;
                local_d30.valid = (int *)local_ce0;
                local_d30.geometryUserPtr = pGVar14->userPtr;
                local_d30.hit = local_920;
                local_d30.N = 8;
                local_d30.ray = (RTCRayN *)ray;
                if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar14->occlusionFilterN)(&local_d30);
                }
                auVar69 = vpcmpeqd_avx2(local_ce0,_DAT_01faff00);
                auVar90 = _DAT_01fe9960 & ~auVar69;
                if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar90 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar90 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar90 >> 0x7f,0) == '\0') &&
                      (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar90 >> 0xbf,0) == '\0') &&
                    (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar90[0x1f]) {
                  auVar69 = auVar69 ^ _DAT_01fe9960;
                }
                else {
                  p_Var18 = context->args->filter;
                  if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar14->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var18)(&local_d30);
                  }
                  auVar90 = vpcmpeqd_avx2(local_ce0,_DAT_01faff00);
                  auVar69 = auVar90 ^ _DAT_01fe9960;
                  auVar76._8_4_ = 0xff800000;
                  auVar76._0_8_ = 0xff800000ff800000;
                  auVar76._12_4_ = 0xff800000;
                  auVar76._16_4_ = 0xff800000;
                  auVar76._20_4_ = 0xff800000;
                  auVar76._24_4_ = 0xff800000;
                  auVar76._28_4_ = 0xff800000;
                  auVar90 = vblendvps_avx(auVar76,*(undefined1 (*) [32])(local_d30.ray + 0x100),
                                          auVar90);
                  *(undefined1 (*) [32])(local_d30.ray + 0x100) = auVar90;
                }
                if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar69 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar69 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar69 >> 0x7f,0) != '\0') ||
                      (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar69 >> 0xbf,0) != '\0') ||
                    (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar69[0x1f] < '\0') goto LAB_00585b99;
                auVar81 = ZEXT3264(local_d00);
                *(int *)(ray + k * 4 + 0x100) = local_d00._0_4_;
              }
              uVar45 = uVar45 ^ 1L << (uVar47 & 0x3f);
            } while (uVar45 != 0);
          }
        }
        lVar41 = lVar41 + 1;
      } while (lVar41 != uVar39 - 8);
    }
    auVar81 = ZEXT1664(local_c40);
    auVar83 = ZEXT1664(local_c50);
    auVar86 = ZEXT1664(local_c60);
    auVar92 = ZEXT1664(local_c70);
    auVar96 = ZEXT1664(local_c80);
    auVar102 = ZEXT1664(local_c90);
    auVar111 = ZEXT1664(local_ca0);
    auVar114 = ZEXT1664(local_cb0);
joined_r0x00585b75:
    bVar37 = puVar53 != &local_800;
    if (!bVar37) {
      return bVar37;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }